

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS
ref_iso_triangle_segment
          (REF_DBL *triangle0,REF_DBL *triangle1,REF_DBL *triangle2,REF_DBL *segment0,
          REF_DBL *segment1,REF_DBL *tuvw)

{
  REF_STATUS RVar1;
  REF_DBL RVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_DBL RVar6;
  double dVar7;
  double dVar8;
  REF_DBL RVar9;
  
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;
  *tuvw = 0.0;
  tuvw[1] = 0.0;
  RVar2 = ref_iso_volume(triangle0,triangle1,triangle2,segment0);
  RVar3 = ref_iso_volume(triangle0,triangle1,triangle2,segment1);
  RVar4 = ref_iso_volume(triangle0,triangle1,segment0,segment1);
  RVar5 = ref_iso_volume(triangle1,triangle2,segment0,segment1);
  RVar6 = ref_iso_volume(triangle2,triangle0,segment0,segment1);
  dVar8 = (RVar2 - RVar3) * 1e+20;
  if (dVar8 <= -dVar8) {
    dVar8 = -dVar8;
  }
  RVar9 = RVar2;
  if (RVar2 <= -RVar2) {
    RVar9 = -RVar2;
  }
  RVar1 = 4;
  if (RVar9 < dVar8) {
    *tuvw = RVar2 / (RVar2 - RVar3);
    dVar7 = RVar5 + RVar6 + RVar4;
    dVar8 = dVar7 * 1e+20;
    if (dVar8 <= -dVar8) {
      dVar8 = -dVar8;
    }
    RVar2 = RVar5;
    if (RVar5 <= -RVar5) {
      RVar2 = -RVar5;
    }
    if (RVar2 < dVar8) {
      RVar2 = RVar6;
      if (RVar6 <= -RVar6) {
        RVar2 = -RVar6;
      }
      if (RVar2 < dVar8) {
        RVar2 = RVar4;
        if (RVar4 <= -RVar4) {
          RVar2 = -RVar4;
        }
        if (RVar2 < dVar8) {
          tuvw[1] = RVar5 / dVar7;
          tuvw[2] = RVar6 / dVar7;
          tuvw[3] = RVar4 / dVar7;
          RVar1 = 0;
        }
      }
    }
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_iso_triangle_segment(REF_DBL *triangle0,
                                            REF_DBL *triangle1,
                                            REF_DBL *triangle2,
                                            REF_DBL *segment0,
                                            REF_DBL *segment1, REF_DBL *tuvw) {
  double top_volume, bot_volume;
  double side0_volume, side1_volume, side2_volume;
  double total_volume;

  tuvw[0] = 0.0;
  tuvw[1] = 0.0;
  tuvw[2] = 0.0;
  tuvw[3] = 0.0;

  /* is segment in triangle plane? */
  top_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment0);
  bot_volume = ref_iso_volume(triangle0, triangle1, triangle2, segment1);

  /* does segment pass through triangle? */
  side2_volume = ref_iso_volume(triangle0, triangle1, segment0, segment1);
  side0_volume = ref_iso_volume(triangle1, triangle2, segment0, segment1);
  side1_volume = ref_iso_volume(triangle2, triangle0, segment0, segment1);

  total_volume = top_volume - bot_volume;
  if (ref_math_divisible(top_volume, total_volume)) {
    tuvw[0] = top_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  total_volume = side0_volume + side1_volume + side2_volume;
  if (ref_math_divisible(side0_volume, total_volume) &&
      ref_math_divisible(side1_volume, total_volume) &&
      ref_math_divisible(side2_volume, total_volume)) {
    tuvw[1] = side0_volume / total_volume;
    tuvw[2] = side1_volume / total_volume;
    tuvw[3] = side2_volume / total_volume;
  } else {
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}